

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

void __thiscall helics::CoreBroker::addPublication(CoreBroker *this,ActionMessage *message)

{
  GlobalFederateId fed_id;
  InterfaceHandle IVar1;
  byte *pbVar2;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  string_view type;
  string_view units;
  bool bVar6;
  string *psVar7;
  BasicHandleInfo *handleInfo;
  string_view key;
  
  bVar6 = checkInterfaceCreation(this,message,PUBLICATION);
  if (!bVar6) {
    return;
  }
  fed_id.gid = (message->source_id).gid;
  IVar1.hid = (message->source_handle).hid;
  pbVar2 = (message->payload).heap;
  sVar3 = (message->payload).bufferSize;
  psVar7 = ActionMessage::getString_abi_cxx11_(message,0);
  pcVar4 = (psVar7->_M_dataplus)._M_p;
  sVar5 = psVar7->_M_string_length;
  psVar7 = ActionMessage::getString_abi_cxx11_(message,1);
  type._M_str = pcVar4;
  type._M_len = sVar5;
  units._M_str = (psVar7->_M_dataplus)._M_p;
  units._M_len = psVar7->_M_string_length;
  key._M_str = (char *)pbVar2;
  key._M_len = sVar3;
  handleInfo = HandleManager::addHandle(&this->handles,fed_id,IVar1,PUBLICATION,key,type,units);
  addLocalInfo(this,handleInfo,message);
  if ((this->super_BrokerBase).field_0x294 != '\0') {
    findAndNotifyPublicationTargets(this,handleInfo,&handleInfo->key);
    return;
  }
  (*(this->super_Broker)._vptr_Broker[0x22])(this,0,message);
  return;
}

Assistant:

void CoreBroker::addPublication(ActionMessage& message)
{
    if (!checkInterfaceCreation(message, InterfaceType::PUBLICATION)) {
        return;
    }
    auto& pub = handles.addHandle(message.source_id,
                                  message.source_handle,
                                  InterfaceType::PUBLICATION,
                                  message.name(),
                                  message.getString(typeStringLoc),
                                  message.getString(unitStringLoc));

    addLocalInfo(pub, message);
    if (!isRootc) {
        transmit(parent_route_id, message);
    } else {
        findAndNotifyPublicationTargets(pub, pub.key);
    }
}